

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O1

_Bool trans_ST1_zpiz(DisasContext_conflict1 *s,arg_ST1_zpiz *a)

{
  int iVar1;
  int iVar2;
  MemOp MVar3;
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var4;
  undefined8 *puVar5;
  gen_helper_gvec_mem_scatter *fn;
  TCGv_i64 scalar;
  uintptr_t o;
  
  iVar1 = a->esz;
  iVar2 = a->msz;
  if (iVar1 < iVar2) goto LAB_006760d9;
  tcg_ctx = s->uc->tcg_ctx;
  MVar3 = s->be_data;
  _Var4 = sve_access_check_aarch64(s);
  if (!_Var4) goto LAB_006760d9;
  if (a->esz == 3) {
    puVar5 = (undefined8 *)
             ((long)scatter_store_fn64[0][2] +
             (ulong)((uint)(MVar3 == MO_BE) * 0x60) + (long)a->msz * 8);
LAB_0067607a:
    fn = (gen_helper_gvec_mem_scatter *)*puVar5;
  }
  else {
    if (a->esz == 2) {
      puVar5 = (undefined8 *)
               ((long)scatter_store_fn32[0][0] +
               (long)a->msz * 8 + (ulong)((uint)(MVar3 == MO_BE) * 0x30));
      goto LAB_0067607a;
    }
    fn = (gen_helper_gvec_mem_scatter *)0x0;
  }
  if (fn == (gen_helper_gvec_mem_scatter *)0x0) {
    __assert_fail("fn != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-sve.c"
                  ,0x1593,"_Bool trans_ST1_zpiz(DisasContext *, arg_ST1_zpiz *)");
  }
  scalar = tcg_const_i64_aarch64(tcg_ctx,(long)(a->imm << ((byte)a->msz & 0x1f)));
  do_mem_zpz(s,a->rd,a->pg,a->rn,0,scalar,a->msz,fn);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(scalar + (long)tcg_ctx));
LAB_006760d9:
  return iVar2 <= iVar1;
}

Assistant:

static bool trans_ST1_zpiz(DisasContext *s, arg_ST1_zpiz *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    gen_helper_gvec_mem_scatter *fn = NULL;
    int be = s->be_data == MO_BE;
    TCGv_i64 imm;

    if (a->esz < a->msz) {
        return false;
    }
    if (!sve_access_check(s)) {
        return true;
    }

    switch (a->esz) {
    case MO_32:
        fn = scatter_store_fn32[be][0][a->msz];
        break;
    case MO_64:
        fn = scatter_store_fn64[be][2][a->msz];
        break;
    }
    assert(fn != NULL);

    /* Treat ST1_zpiz (zn[x] + imm) the same way as ST1_zprz (rn + zm[x])
     * by loading the immediate into the scalar parameter.
     */
    imm = tcg_const_i64(tcg_ctx, a->imm << a->msz);
    do_mem_zpz(s, a->rd, a->pg, a->rn, 0, imm, a->msz, fn);
    tcg_temp_free_i64(tcg_ctx, imm);
    return true;
}